

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,1>>,Eigen::internal::mul_assign_op<float,float>>
               (Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>
               *src,mul_assign_op<float,_float> *func)

{
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType local_58;
  DstEvaluatorType local_50;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>
  local_38;
  
  local_58.m_functor.m_other = (src->m_functor).m_other;
  resize_if_allowed<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,1>>,Eigen::internal::mul_assign_op<float,float>>
            (dst,src,func);
  local_50.super_block_evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>
  .m_data = (dst->
            super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>.
            m_data;
  local_38.m_dst = &local_50;
  local_50.super_block_evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,_1>_>
  .m_outerStride.m_value =
       (((dst->super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_Eigen::Dense>).
         super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.m_xpr)->
       super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_38.m_src = &local_58;
  local_38.m_functor = func;
  local_38.m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>,_4,_0>
  ::run(&local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}